

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brng.c
# Opt level: O1

void brngCTRStepR(void *buf,size_t count,void *state)

{
  size_t *psVar1;
  void *pvVar2;
  long *plVar3;
  ulong *puVar4;
  uint *puVar5;
  uint *puVar6;
  uint *puVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  size_t sVar14;
  size_t sVar15;
  ulong uVar16;
  long lVar17;
  word *w;
  void *buf_00;
  size_t count_00;
  
  psVar1 = (size_t *)((long)state + 0x60);
  uVar16 = *(ulong *)((long)state + 0x60);
  if (uVar16 != 0) {
    if (count <= uVar16) {
      memCopy(buf,(void *)((long)psVar1 - uVar16),count);
      count_00 = *psVar1 - count;
      goto LAB_0013c4b3;
    }
    memCopy(buf,(void *)((long)psVar1 - uVar16),uVar16);
    count = count - *psVar1;
    buf = (void *)((long)buf + *psVar1);
    *psVar1 = 0;
  }
  if (0x1f < count) {
    pvVar2 = (void *)((long)state + 0x68);
    do {
      sVar14 = beltHash_keep();
      sVar15 = beltHash_keep();
      memCopy(pvVar2,(void *)(sVar14 + (long)pvVar2),sVar15);
      beltHashStepH(state,0x20,pvVar2);
      beltHashStepH(buf,0x20,pvVar2);
      beltHashStepH((void *)((long)state + 0x20),0x20,pvVar2);
      beltHashStepG((octet *)buf,pvVar2);
      uVar16 = 0;
      do {
        plVar3 = (long *)((long)state + uVar16 * 8);
        *plVar3 = *plVar3 + 1;
        if (3 < uVar16) break;
        uVar16 = uVar16 + 1;
      } while (*plVar3 == 0);
      lVar17 = 7;
      do {
        puVar4 = (ulong *)((long)state + lVar17 * 8);
        *puVar4 = *puVar4 ^ *(ulong *)((long)buf + lVar17 * 8 + -0x20);
        lVar17 = lVar17 + -1;
      } while (lVar17 != 3);
      buf = (void *)((long)buf + 0x20);
      count = count - 0x20;
    } while (0x1f < count);
  }
  if (count == 0) {
    return;
  }
  buf_00 = (void *)((long)state + count + 0x40);
  count_00 = 0x20 - count;
  uVar16 = 0;
  memSet(buf_00,'\0',count_00);
  pvVar2 = (void *)((long)state + 0x68);
  sVar14 = beltHash_keep();
  sVar15 = beltHash_keep();
  memCopy(pvVar2,(void *)((long)state + sVar14 + 0x68),sVar15);
  beltHashStepH(state,0x20,pvVar2);
  beltHashStepH(buf,count,pvVar2);
  beltHashStepH(buf_00,count_00,pvVar2);
  beltHashStepH((void *)((long)state + 0x20),0x20,pvVar2);
  beltHashStepG((octet *)((long)state + 0x40),pvVar2);
  memCopy(buf,(octet *)((long)state + 0x40),count);
  do {
    plVar3 = (long *)((long)state + uVar16 * 8);
    *plVar3 = *plVar3 + 1;
    if (3 < uVar16) break;
    uVar16 = uVar16 + 1;
  } while (*plVar3 == 0);
  lVar17 = 6;
  do {
    puVar5 = (uint *)((long)state + lVar17 * 8);
    uVar8 = puVar5[1];
    uVar9 = puVar5[2];
    uVar10 = puVar5[3];
    puVar7 = (uint *)((long)state + lVar17 * 8 + 0x20);
    uVar11 = puVar7[1];
    uVar12 = puVar7[2];
    uVar13 = puVar7[3];
    puVar6 = (uint *)((long)state + lVar17 * 8);
    *puVar6 = *puVar7 ^ *puVar5;
    puVar6[1] = uVar11 ^ uVar8;
    puVar6[2] = uVar12 ^ uVar9;
    puVar6[3] = uVar13 ^ uVar10;
    lVar17 = lVar17 + -2;
  } while (lVar17 != 2);
LAB_0013c4b3:
  *psVar1 = count_00;
  return;
}

Assistant:

void brngCTRStepR(void* buf, size_t count, void* state)
{
	brng_ctr_st* s = (brng_ctr_st*)state;
	ASSERT(memIsDisjoint2(buf, count, s, brngCTR_keep()));
	// есть резерв данных?
	if (s->reserved)
	{
		if (s->reserved >= count)
		{
			memCopy(buf, s->block + 32 - s->reserved, count);
			s->reserved -= count;
			return;
		}
		memCopy(buf, s->block + 32 - s->reserved, s->reserved);
		count -= s->reserved;
		buf = (octet*)buf + s->reserved;
		s->reserved = 0;
	}
	// цикл по полным блокам
	while (count >= 32)
	{
		// Y_t <- belt-hash(key || s || X_t || r)
		memCopy(s->state_ex, s->state_ex + beltHash_keep(), beltHash_keep());
		beltHashStepH(s->s, 32, s->state_ex);
		beltHashStepH(buf, 32, s->state_ex);
		beltHashStepH(s->r, 32, s->state_ex);
		beltHashStepG(buf, s->state_ex);
		// next
		brngBlockInc(s->s);
		brngBlockXor2(s->r, buf);
		buf = (octet*)buf + 32;
		count -= 32;
	}
	// неполный блок?
	if (count)
	{
		// block <- beltHash(key || s || zero_pad(X_t) || r)
		memSetZero(s->block + count, 32 - count);
		memCopy(s->state_ex, s->state_ex + beltHash_keep(), beltHash_keep());
		beltHashStepH(s->s, 32, s->state_ex);
		beltHashStepH(buf, count, s->state_ex);
		beltHashStepH(s->block + count, 32 - count, s->state_ex);
		beltHashStepH(s->r, 32, s->state_ex);
		beltHashStepG(s->block, s->state_ex);
		// Y_t <- left(block)
		memCopy(buf, s->block, count);
		// next
		brngBlockInc(s->s);
		brngBlockXor2(s->r, s->block);
		s->reserved = 32 - count;
	}
}